

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_ctrlpt.c
# Opt level: O2

int genaSubscribe(UpnpClient_Handle client_handle,UpnpString *PublisherURL,int *TimeOut,
                 UpnpString *out_sid)

{
  UpnpClient_Handle client_handle_00;
  Upnp_Handle_Type UVar1;
  uint uVar2;
  uint uVar3;
  GenlibClientSubscription *p;
  UpnpString *sid;
  UpnpString *p_00;
  int iVar4;
  Handle_Info **ppHVar5;
  int *piVar6;
  UpnpString *pUVar7;
  Handle_Info *handle_info;
  UpnpClient_Handle local_b4;
  UpnpString *local_b0;
  Upnp_SID temp_sid2;
  Upnp_SID temp_sid;
  uuid_upnp uid;
  
  p = GenlibClientSubscription_new();
  sid = UpnpString_new();
  p_00 = UpnpString_new();
  temp_sid[0] = '\0';
  temp_sid[1] = '\0';
  temp_sid[2] = '\0';
  temp_sid[3] = '\0';
  temp_sid[4] = '\0';
  temp_sid[5] = '\0';
  temp_sid[6] = '\0';
  temp_sid[7] = '\0';
  temp_sid[8] = '\0';
  temp_sid[9] = '\0';
  temp_sid[10] = '\0';
  temp_sid[0xb] = '\0';
  temp_sid[0xc] = '\0';
  temp_sid[0xd] = '\0';
  temp_sid[0xe] = '\0';
  temp_sid[0xf] = '\0';
  temp_sid[0x10] = '\0';
  temp_sid[0x11] = '\0';
  temp_sid[0x12] = '\0';
  temp_sid[0x13] = '\0';
  temp_sid[0x14] = '\0';
  temp_sid[0x15] = '\0';
  temp_sid[0x16] = '\0';
  temp_sid[0x17] = '\0';
  temp_sid[0x18] = '\0';
  temp_sid[0x19] = '\0';
  temp_sid[0x1a] = '\0';
  temp_sid[0x1b] = '\0';
  temp_sid[0x1c] = '\0';
  temp_sid[0x1d] = '\0';
  temp_sid[0x1e] = '\0';
  temp_sid[0x1f] = '\0';
  temp_sid[0x20] = '\0';
  temp_sid[0x21] = '\0';
  temp_sid[0x22] = '\0';
  temp_sid[0x23] = '\0';
  temp_sid[0x24] = '\0';
  temp_sid[0x25] = '\0';
  temp_sid[0x26] = '\0';
  temp_sid[0x27] = '\0';
  temp_sid[0x28] = '\0';
  temp_sid[0x29] = '\0';
  temp_sid[0x2a] = '\0';
  temp_sid[0x2b] = '\0';
  temp_sid2[0] = '\0';
  temp_sid2[1] = '\0';
  temp_sid2[2] = '\0';
  temp_sid2[3] = '\0';
  temp_sid2[4] = '\0';
  temp_sid2[5] = '\0';
  temp_sid2[6] = '\0';
  temp_sid2[7] = '\0';
  temp_sid2[8] = '\0';
  temp_sid2[9] = '\0';
  temp_sid2[10] = '\0';
  temp_sid2[0xb] = '\0';
  temp_sid2[0xc] = '\0';
  temp_sid2[0xd] = '\0';
  temp_sid2[0xe] = '\0';
  temp_sid2[0xf] = '\0';
  temp_sid2[0x10] = '\0';
  temp_sid2[0x11] = '\0';
  temp_sid2[0x12] = '\0';
  temp_sid2[0x13] = '\0';
  temp_sid2[0x14] = '\0';
  temp_sid2[0x15] = '\0';
  temp_sid2[0x16] = '\0';
  temp_sid2[0x17] = '\0';
  temp_sid2[0x18] = '\0';
  temp_sid2[0x19] = '\0';
  temp_sid2[0x1a] = '\0';
  temp_sid2[0x1b] = '\0';
  temp_sid2[0x1c] = '\0';
  temp_sid2[0x1d] = '\0';
  temp_sid2[0x1e] = '\0';
  temp_sid2[0x1f] = '\0';
  temp_sid2[0x20] = '\0';
  temp_sid2[0x21] = '\0';
  temp_sid2[0x22] = '\0';
  temp_sid2[0x23] = '\0';
  temp_sid2[0x24] = '\0';
  temp_sid2[0x25] = '\0';
  temp_sid2[0x26] = '\0';
  temp_sid2[0x27] = '\0';
  temp_sid2[0x28] = '\0';
  temp_sid2[0x29] = '\0';
  temp_sid2[0x2a] = '\0';
  temp_sid2[0x2b] = '\0';
  iVar4 = 2;
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x24b,"GENA SUBSCRIBE BEGIN\n");
  UpnpString_clear(out_sid);
  HandleReadLock((char *)0x24f,iVar4);
  ppHVar5 = &handle_info;
  UVar1 = GetHandleInfo(client_handle,ppHVar5);
  if (UVar1 == HND_CLIENT) {
    local_b4 = client_handle;
    HandleUnlock((char *)0x256,(int)ppHVar5);
    UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x259,"Trying Subscribe Lock");
    pthread_mutex_lock((pthread_mutex_t *)&GlobalClientSubscribeMutex);
    UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x259,"Subscribe Lock");
    piVar6 = TimeOut;
    uVar2 = gena_subscribe(PublisherURL,TimeOut,(UpnpString *)0x0,sid);
    HandleLock((char *)0x25b,(int)piVar6);
    client_handle_00 = local_b4;
    if (uVar2 == 0) {
      ppHVar5 = &handle_info;
      local_b0 = PublisherURL;
      UVar1 = GetHandleInfo(local_b4,ppHVar5);
      iVar4 = (int)ppHVar5;
      if (UVar1 == HND_CLIENT) {
        uuid_create(&uid);
        upnp_uuid_unpack(&uid,temp_sid);
        iVar4 = 0x2c;
        uVar3 = snprintf(temp_sid2,0x2c,"uuid:%s",temp_sid);
        uVar2 = 0xffffff98;
        if (uVar3 < 0x2c) {
          UpnpString_set_String(out_sid,temp_sid2);
          pUVar7 = local_b0;
          UpnpString_assign(p_00,local_b0);
          iVar4 = (int)pUVar7;
          if (p != (GenlibClientSubscription *)0x0) {
            GenlibClientSubscription_set_RenewEventId(p,-1);
            GenlibClientSubscription_set_SID(p,out_sid);
            GenlibClientSubscription_set_ActualSID(p,sid);
            GenlibClientSubscription_set_EventURL(p,p_00);
            GenlibClientSubscription_set_Next(p,handle_info->ClientSubList);
            handle_info->ClientSubList = p;
            iVar4 = *TimeOut;
            uVar2 = ScheduleGenaAutoRenew(client_handle_00,iVar4,p);
          }
        }
      }
      else {
        uVar2 = 0xffffff9c;
      }
    }
    else {
      iVar4 = 2;
      UpnpPrintf(UPNP_CRITICAL,GENA,".upnp/src/gena/gena_ctrlpt.c",0x260,
                 "SUBSCRIBE FAILED in transfer error code: %d returned\n",(ulong)uVar2);
    }
  }
  else {
    iVar4 = 2;
    UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x253,"Trying Subscribe Lock");
    pthread_mutex_lock((pthread_mutex_t *)&GlobalClientSubscribeMutex);
    UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x253,"Subscribe Lock");
    uVar2 = 0xffffff9c;
  }
  UpnpString_delete(sid);
  UpnpString_delete(p_00);
  if (uVar2 != 0) {
    GenlibClientSubscription_delete(p);
  }
  HandleUnlock((char *)0x28f,iVar4);
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x290,"Trying Subscribe UnLock");
  pthread_mutex_unlock((pthread_mutex_t *)&GlobalClientSubscribeMutex);
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x290,"Subscribe UnLock");
  return uVar2;
}

Assistant:

int genaSubscribe(UpnpClient_Handle client_handle,
	const UpnpString *PublisherURL,
	int *TimeOut,
	UpnpString *out_sid)
{
	int return_code = GENA_SUCCESS;
	GenlibClientSubscription *newSubscription =
		GenlibClientSubscription_new();
	uuid_upnp uid;
	Upnp_SID temp_sid;
	Upnp_SID temp_sid2;
	UpnpString *ActualSID = UpnpString_new();
	UpnpString *EventURL = UpnpString_new();
	struct Handle_Info *handle_info;
	int rc = 0;

	memset(temp_sid, 0, sizeof(temp_sid));
	memset(temp_sid2, 0, sizeof(temp_sid2));

	UpnpPrintf(
		UPNP_INFO, GENA, __FILE__, __LINE__, "GENA SUBSCRIBE BEGIN\n");

	UpnpString_clear(out_sid);

	HandleReadLock(__FILE__, __LINE__);
	/* validate handle */
	if (GetHandleInfo(client_handle, &handle_info) != HND_CLIENT) {
		return_code = GENA_E_BAD_HANDLE;
		SubscribeLock();
		goto error_handler;
	}
	HandleUnlock(__FILE__, __LINE__);

	/* subscribe */
	SubscribeLock();
	return_code = gena_subscribe(PublisherURL, TimeOut, NULL, ActualSID);
	HandleLock(__FILE__, __LINE__);
	if (return_code != UPNP_E_SUCCESS) {
		UpnpPrintf(UPNP_CRITICAL,
			GENA,
			__FILE__,
			__LINE__,
			"SUBSCRIBE FAILED in transfer error code: %d "
			"returned\n",
			return_code);
		goto error_handler;
	}

	if (GetHandleInfo(client_handle, &handle_info) != HND_CLIENT) {
		return_code = GENA_E_BAD_HANDLE;
		goto error_handler;
	}

	/* generate client SID */
	uuid_create(&uid);
	upnp_uuid_unpack(&uid, temp_sid);
	rc = snprintf(temp_sid2, sizeof(temp_sid2), "uuid:%s", temp_sid);
	if (rc < 0 || (unsigned int)rc >= sizeof(temp_sid2)) {
		return_code = UPNP_E_OUTOF_MEMORY;
		goto error_handler;
	}
	UpnpString_set_String(out_sid, temp_sid2);

	/* create event url */
	UpnpString_assign(EventURL, PublisherURL);

	/* fill subscription */
	if (newSubscription == NULL) {
		return_code = UPNP_E_OUTOF_MEMORY;
		goto error_handler;
	}
	GenlibClientSubscription_set_RenewEventId(newSubscription, -1);
	GenlibClientSubscription_set_SID(newSubscription, out_sid);
	GenlibClientSubscription_set_ActualSID(newSubscription, ActualSID);
	GenlibClientSubscription_set_EventURL(newSubscription, EventURL);
	GenlibClientSubscription_set_Next(
		newSubscription, handle_info->ClientSubList);
	handle_info->ClientSubList = newSubscription;

	/* schedule expiration event */
	return_code =
		ScheduleGenaAutoRenew(client_handle, *TimeOut, newSubscription);

error_handler:
	UpnpString_delete(ActualSID);
	UpnpString_delete(EventURL);
	if (return_code != UPNP_E_SUCCESS)
		GenlibClientSubscription_delete(newSubscription);
	HandleUnlock(__FILE__, __LINE__);
	SubscribeUnlock();

	return return_code;
}